

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O3

int __thiscall ncnn::Crop::forward(Crop *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Allocator *pAVar4;
  ulong uVar5;
  int *piVar6;
  long lVar7;
  Option *pOVar8;
  int iVar9;
  size_t sVar10;
  int h;
  void *pvVar11;
  void *__src;
  int _woffset;
  int _hoffset;
  int _outc;
  int _coffset;
  int local_174;
  int _outh;
  int _outw;
  Option *local_168;
  int local_160;
  int local_15c;
  ulong local_158;
  size_t local_150;
  long local_148;
  int local_13c;
  Mat local_138;
  void *local_f0;
  size_t local_e8;
  long local_e0;
  Mat local_d8;
  long local_90;
  undefined1 *local_88;
  Mat *local_80;
  Allocator *local_78;
  Mat local_70;
  
  iVar1 = bottom_blob->w;
  local_e0 = (long)iVar1;
  iVar9 = bottom_blob->h;
  iVar2 = bottom_blob->dims;
  sVar10 = bottom_blob->elemsize;
  if (iVar2 == 3) {
    iVar2 = bottom_blob->c;
    local_d8.data = (void *)0x0;
    local_d8.refcount._0_4_ = 0;
    local_d8.refcount._4_4_ = 0;
    local_d8.elemsize._0_4_ = 4;
    local_d8.elemsize._4_4_ = 0;
    local_d8.elempack = 1;
    local_d8.allocator = (Allocator *)0x0;
    local_d8.w = iVar1;
    local_d8.dims = 3;
    local_d8.c = bottom_blob->elempack * iVar2;
    local_d8.h = iVar9;
    local_e8 = (size_t)(iVar9 * iVar1);
    local_d8.cstep = local_e8 + 3 & 0x3ffffffffffffffc;
    local_174 = iVar9;
    local_168 = opt;
    local_150 = sVar10;
    resolve_crop_roi(this,&local_d8,&_woffset,&_hoffset,&_coffset,&_outw,&_outh,&_outc);
    sVar10 = local_150;
    if ((_outh != local_174 || _outw != iVar1) || _outc != iVar2) {
      local_f0 = (void *)((long)_coffset * bottom_blob->cstep * local_150 + (long)bottom_blob->data)
      ;
      local_15c = bottom_blob->elempack;
      local_d8.allocator = bottom_blob->allocator;
      local_d8.refcount._0_4_ = 0;
      local_d8.refcount._4_4_ = 0;
      local_d8.elemsize._0_4_ = (undefined4)local_150;
      local_d8.elemsize._4_4_ = (undefined4)(local_150 >> 0x20);
      local_d8.dims = 3;
      local_d8.c = _outc;
      local_d8.h = local_174;
      local_158 = (local_150 * local_e8 + 0xf & 0xfffffffffffffff0) / local_150;
      local_d8.data = local_f0;
      local_d8.elempack = local_15c;
      local_d8.cstep = local_158;
      local_78 = local_d8.allocator;
      if (_outh != local_174 || _outw != iVar1) {
        Mat::create(top_blob,_outw,_outh,_outc,local_150,local_168->blob_allocator);
        iVar9 = -100;
        if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
        goto LAB_0012e863;
        if (0 < _outc) {
          local_88 = (undefined1 *)(ulong)(uint)_outc;
          local_158 = local_158 * sVar10;
          local_148 = (long)_woffset;
          local_160 = _hoffset;
          local_90 = (long)(_hoffset * iVar1);
          pOVar8 = (Option *)0x0;
          local_13c = iVar1;
          local_80 = top_blob;
          do {
            local_138.data = (void *)(local_158 * (long)pOVar8 + (long)local_f0);
            local_138.refcount._0_4_ = 0;
            local_138.refcount._4_4_ = 0;
            local_138.elemsize._0_4_ = (undefined4)sVar10;
            local_138.elemsize._4_4_ = (undefined4)(sVar10 >> 0x20);
            local_138.elempack = local_15c;
            local_138.allocator = local_78;
            local_138.w = local_13c;
            local_138.dims = 2;
            local_138.c = 1;
            local_138.h = local_174;
            local_138.cstep = local_e8;
            uVar3 = local_80->w;
            iVar1 = local_80->h;
            local_70.elemsize = local_80->elemsize;
            pvVar11 = (void *)(local_80->cstep * (long)pOVar8 * local_70.elemsize +
                              (long)local_80->data);
            local_70.elempack = local_80->elempack;
            local_70.allocator = local_80->allocator;
            local_70.refcount = (int *)0x0;
            local_70.dims = 2;
            local_70.c = 1;
            local_70.cstep = (size_t)(int)(iVar1 * uVar3);
            local_168 = pOVar8;
            local_70.data = pvVar11;
            local_70.w = uVar3;
            local_70.h = iVar1;
            if (sVar10 == 4) {
              copy_cut_border_image<float>(&local_138,&local_70,local_160,(int)local_148);
            }
            else if (sVar10 == 2) {
              copy_cut_border_image<unsigned_short>(&local_138,&local_70,local_160,(int)local_148);
            }
            else if ((sVar10 == 1) && (0 < iVar1)) {
              __src = (void *)((long)local_138.data + local_148 + local_90);
              iVar9 = 0;
              do {
                if ((int)uVar3 < 0xc) {
                  if (0 < (int)uVar3) {
                    uVar5 = 0;
                    do {
                      *(undefined1 *)((long)pvVar11 + uVar5) = *(undefined1 *)((long)__src + uVar5);
                      uVar5 = uVar5 + 1;
                    } while (uVar3 != uVar5);
                  }
                }
                else {
                  memcpy(pvVar11,__src,(ulong)uVar3);
                }
                pvVar11 = (void *)((long)pvVar11 + (long)(int)uVar3);
                __src = (void *)((long)__src + local_e0);
                iVar9 = iVar9 + 1;
              } while (iVar9 != iVar1);
            }
            pOVar8 = (Option *)&local_168->field_0x1;
            sVar10 = local_150;
          } while (pOVar8 < local_88);
        }
      }
      else {
        local_138.elemsize._0_4_ = 0;
        local_138.elemsize._4_4_ = 0;
        local_138.elempack = 0;
        local_138.data = (void *)0x0;
        local_138.refcount._0_4_ = 0;
        local_138.refcount._4_4_ = 0;
        local_138.allocator = (Allocator *)0x0;
        local_138.dims = 0;
        local_138.w = 0;
        local_138.h = 0;
        local_138.c = 0;
        local_138.cstep = 0;
        if ((bottom_blob->data != (void *)0x0) && (lVar7 = local_158 * (long)_outc, lVar7 != 0)) {
          Mat::create(&local_138,iVar1,local_174,_outc,local_150,local_15c,(Allocator *)0x0);
          memcpy(local_138.data,local_f0,sVar10 * lVar7);
        }
        piVar6 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
        if (&local_138 != top_blob) {
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          piVar6 = top_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (**(code **)(*(long *)top_blob->allocator + 0x18))();
              }
            }
          }
          top_blob->data = local_138.data;
          piVar6 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
          top_blob->refcount = piVar6;
          top_blob->elemsize = CONCAT44(local_138.elemsize._4_4_,(undefined4)local_138.elemsize);
          top_blob->elempack = local_138.elempack;
          top_blob->allocator = local_138.allocator;
          top_blob->dims = local_138.dims;
          top_blob->w = local_138.w;
          top_blob->h = local_138.h;
          top_blob->c = local_138.c;
          top_blob->cstep = local_138.cstep;
        }
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_138.allocator == (Allocator *)0x0) {
              if (local_138.data != (void *)0x0) {
                free(local_138.data);
              }
            }
            else {
              (**(code **)(*(long *)local_138.allocator + 0x18))();
            }
          }
        }
        if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0)) {
          iVar9 = -100;
          goto LAB_0012e863;
        }
      }
      iVar9 = 0;
LAB_0012e863:
      piVar6 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
      if (piVar6 == (int *)0x0) {
        return iVar9;
      }
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 != 0) {
        return iVar9;
      }
      if (local_d8.allocator != (Allocator *)0x0) {
        (**(code **)(*(long *)local_d8.allocator + 0x18))();
        return iVar9;
      }
      if (local_d8.data == (void *)0x0) {
        return iVar9;
      }
      free(local_d8.data);
      return iVar9;
    }
    if (top_blob == bottom_blob) {
      return 0;
    }
    piVar6 = bottom_blob->refcount;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    piVar6 = top_blob->refcount;
    if (piVar6 == (int *)0x0) goto LAB_0012e76c;
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 != 0) goto LAB_0012e76c;
    pvVar11 = top_blob->data;
    pAVar4 = top_blob->allocator;
  }
  else if (iVar2 == 2) {
    local_d8.h = bottom_blob->elempack * iVar9;
    local_d8.data = (void *)0x0;
    local_d8.refcount._0_4_ = 0;
    local_d8.refcount._4_4_ = 0;
    local_d8.elemsize._0_4_ = 4;
    local_d8.elemsize._4_4_ = 0;
    local_d8.elempack = 1;
    local_d8.allocator = (Allocator *)0x0;
    local_d8.w = iVar1;
    local_d8.dims = 2;
    local_d8.c = 1;
    local_d8.cstep = (size_t)(local_d8.h * iVar1);
    local_168 = opt;
    local_150 = sVar10;
    resolve_crop_roi(this,&local_d8,&_woffset,&_hoffset,&_coffset,&_outw,&_outh,&_outc);
    sVar10 = local_150;
    if (iVar9 != _outh || iVar1 != _outw) {
      Mat::create(top_blob,_outw,_outh,local_150,local_168->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      if (sVar10 == 4) goto LAB_0012e758;
      if (sVar10 == 2) goto LAB_0012e742;
      if (sVar10 != 1) {
        return 0;
      }
      goto LAB_0012e4b4;
    }
    if (top_blob == bottom_blob) {
      return 0;
    }
    piVar6 = bottom_blob->refcount;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    piVar6 = top_blob->refcount;
    if (piVar6 == (int *)0x0) goto LAB_0012e76c;
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 != 0) goto LAB_0012e76c;
    pvVar11 = top_blob->data;
    pAVar4 = top_blob->allocator;
  }
  else {
    if (iVar2 != 1) {
      local_d8.elemsize._0_4_ = 0;
      local_d8.elemsize._4_4_ = 0;
      local_d8.elempack = 0;
      local_d8.data = (void *)0x0;
      local_d8.refcount._0_4_ = 0;
      local_d8.refcount._4_4_ = 0;
      local_d8.allocator = (Allocator *)0x0;
      local_d8.dims = 0;
      local_d8.w = 0;
      local_d8.h = 0;
      local_d8.c = 0;
      local_d8.cstep = 0;
      resolve_crop_roi(this,&local_d8,&_woffset,&_hoffset,&_coffset,&_outw,&_outh,&_outc);
      return 0;
    }
    local_d8.cstep = bottom_blob->elempack * local_e0;
    local_d8.data = (void *)0x0;
    local_d8.refcount._0_4_ = 0;
    local_d8.refcount._4_4_ = 0;
    local_d8.elemsize._0_4_ = 4;
    local_d8.elemsize._4_4_ = 0;
    local_d8.elempack = 1;
    local_d8.allocator = (Allocator *)0x0;
    local_d8.w = (int)local_d8.cstep;
    local_d8.dims = 1;
    local_d8.h = 1;
    local_d8.c = 1;
    resolve_crop_roi(this,&local_d8,&_woffset,&_hoffset,&_coffset,&_outw,&_outh,&_outc);
    if (_outw != iVar1) {
      Mat::create(top_blob,_outw,sVar10,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      if (sVar10 == 4) {
        _hoffset = 0;
LAB_0012e758:
        copy_cut_border_image<float>(bottom_blob,top_blob,_hoffset,_woffset);
        return 0;
      }
      if (sVar10 == 2) {
        _hoffset = 0;
LAB_0012e742:
        copy_cut_border_image<unsigned_short>(bottom_blob,top_blob,_hoffset,_woffset);
        return 0;
      }
      if (sVar10 != 1) {
        return 0;
      }
      _hoffset = 0;
LAB_0012e4b4:
      copy_cut_border_image<signed_char>(bottom_blob,top_blob,_hoffset,_woffset);
      return 0;
    }
    if (top_blob == bottom_blob) {
      return 0;
    }
    piVar6 = bottom_blob->refcount;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    piVar6 = top_blob->refcount;
    if (piVar6 == (int *)0x0) goto LAB_0012e76c;
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 != 0) goto LAB_0012e76c;
    pvVar11 = top_blob->data;
    pAVar4 = top_blob->allocator;
  }
  if (pAVar4 == (Allocator *)0x0) {
    if (pvVar11 != (void *)0x0) {
      free(pvVar11);
    }
  }
  else {
    (**(code **)(*(long *)pAVar4 + 0x18))();
  }
LAB_0012e76c:
  *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
  *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
  top_blob->data = (void *)0x0;
  top_blob->refcount = (int *)0x0;
  top_blob->dims = 0;
  top_blob->w = 0;
  top_blob->h = 0;
  top_blob->c = 0;
  top_blob->cstep = 0;
  piVar6 = bottom_blob->refcount;
  top_blob->data = bottom_blob->data;
  top_blob->refcount = piVar6;
  top_blob->elemsize = bottom_blob->elemsize;
  top_blob->elempack = bottom_blob->elempack;
  top_blob->allocator = bottom_blob->allocator;
  iVar1 = bottom_blob->w;
  iVar9 = bottom_blob->h;
  iVar2 = bottom_blob->c;
  top_blob->dims = bottom_blob->dims;
  top_blob->w = iVar1;
  top_blob->h = iVar9;
  top_blob->c = iVar2;
  top_blob->cstep = bottom_blob->cstep;
  return 0;
}

Assistant:

int Crop::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int _woffset, _hoffset, _coffset;
    int _outw, _outh, _outc;
    resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _coffset, _outw, _outh, _outc);

    if (dims == 1)
    {
        if (_outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, 0, _woffset);

        return 0;
    }

    if (dims == 2)
    {
        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, _outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, _hoffset, _woffset);

        return 0;
    }

    if (dims == 3)
    {
        if (_outw == w && _outh == h && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob_sliced.clone();
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<_outc; q++)
        {
            const Mat m = bottom_blob_sliced.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
            if (elemsize == 2)
                copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
            if (elemsize == 4)
                copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
        }

        return 0;
    }

    return 0;
}